

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile(cmLocalUnixMakefileGenerator3 *this)

{
  byte bVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  undefined1 local_2f8 [8];
  cmGeneratedFileStream infoFileStream;
  cmAlphaNum local_60;
  undefined1 local_30 [8];
  string infoFileName;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  infoFileName.field_2._8_8_ = this;
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmAlphaNum::cmAlphaNum(&local_60,psVar3);
  cmAlphaNum::cmAlphaNum
            ((cmAlphaNum *)&infoFileStream.field_0x260,"/CMakeFiles/CMakeDirectoryInformation.cmake"
            );
  cmStrCat<>((string *)local_30,&local_60,(cmAlphaNum *)&infoFileStream.field_0x260);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2f8,(string *)local_30,false,None);
  bVar1 = std::ios::operator!((ios *)(local_2f8 + (long)*(_func_int **)((long)local_2f8 + -0x18)));
  if ((bVar1 & 1) == 0) {
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2f8,true);
    WriteDisclaimer(this,(ostream *)local_2f8);
    poVar4 = std::operator<<((ostream *)local_2f8,"# Relative path conversion top directories.\n");
    poVar4 = std::operator<<(poVar4,"set(CMAKE_RELATIVE_PATH_TOP_SOURCE \"");
    psVar3 = cmOutputConverter::GetRelativePathTopSource_abi_cxx11_
                       (&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                         super_cmOutputConverter);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = std::operator<<(poVar4,"\")\n");
    poVar4 = std::operator<<(poVar4,"set(CMAKE_RELATIVE_PATH_TOP_BINARY \"");
    psVar3 = cmOutputConverter::GetRelativePathTopBinary_abi_cxx11_
                       (&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                         super_cmOutputConverter);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = std::operator<<(poVar4,"\")\n");
    std::operator<<(poVar4,"\n");
    bVar2 = cmSystemTools::GetForceUnixPaths();
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)local_2f8,"# Force unix paths in dependencies.\n");
      poVar4 = std::operator<<(poVar4,"set(CMAKE_FORCE_UNIX_PATHS 1)\n");
      std::operator<<(poVar4,"\n");
    }
    poVar4 = std::operator<<((ostream *)local_2f8,"\n");
    poVar4 = std::operator<<(poVar4,"# The C and CXX include file regular expressions for ");
    std::operator<<(poVar4,"this directory.\n");
    std::operator<<((ostream *)local_2f8,"set(CMAKE_C_INCLUDE_REGEX_SCAN ");
    psVar3 = cmMakefile::GetIncludeRegularExpression_abi_cxx11_
                       ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile);
    WriteCMakeArgument((ostream *)local_2f8,psVar3);
    std::operator<<((ostream *)local_2f8,")\n");
    std::operator<<((ostream *)local_2f8,"set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ");
    psVar3 = cmMakefile::GetComplainRegularExpression_abi_cxx11_
                       ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile);
    WriteCMakeArgument((ostream *)local_2f8,psVar3);
    std::operator<<((ostream *)local_2f8,")\n");
    std::operator<<((ostream *)local_2f8,
                    "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n");
    std::operator<<((ostream *)local_2f8,
                    "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN ${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2f8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile()
{
  std::string infoFileName =
    cmStrCat(this->GetCurrentBinaryDirectory(),
             "/CMakeFiles/CMakeDirectoryInformation.cmake");

  // Open the output file.
  cmGeneratedFileStream infoFileStream(infoFileName);
  if (!infoFileStream) {
    return;
  }

  infoFileStream.SetCopyIfDifferent(true);
  // Write the do not edit header.
  this->WriteDisclaimer(infoFileStream);

  // Setup relative path conversion tops.
  /* clang-format off */
  infoFileStream
    << "# Relative path conversion top directories.\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_SOURCE \""
    << this->GetRelativePathTopSource() << "\")\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_BINARY \""
    << this->GetRelativePathTopBinary() << "\")\n"
    << "\n";
  /* clang-format on */

  // Tell the dependency scanner to use unix paths if necessary.
  if (cmSystemTools::GetForceUnixPaths()) {
    /* clang-format off */
    infoFileStream
      << "# Force unix paths in dependencies.\n"
      << "set(CMAKE_FORCE_UNIX_PATHS 1)\n"
      << "\n";
    /* clang-format on */
  }

  // Store the include regular expressions for this directory.
  infoFileStream << "\n"
                 << "# The C and CXX include file regular expressions for "
                 << "this directory.\n";
  infoFileStream << "set(CMAKE_C_INCLUDE_REGEX_SCAN ";
  cmLocalUnixMakefileGenerator3::WriteCMakeArgument(
    infoFileStream, this->Makefile->GetIncludeRegularExpression());
  infoFileStream << ")\n";
  infoFileStream << "set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ";
  cmLocalUnixMakefileGenerator3::WriteCMakeArgument(
    infoFileStream, this->Makefile->GetComplainRegularExpression());
  infoFileStream << ")\n";
  infoFileStream
    << "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n";
  infoFileStream << "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN "
                    "${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n";
}